

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_netstd_struct
          (t_netstd_generator *this,t_struct *tstruct,bool is_exception)

{
  int expected;
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  int __oflag;
  t_netstd_generator *this_00;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> *out;
  string f_struct_name;
  ofstream_with_content_based_conditional_update f_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_248;
  undefined1 local_228 [32];
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_1c8;
  
  expected = (this->super_t_oop_generator).super_t_generator.indent_;
  std::operator+(&bStack_248,&this->namespace_dir_,"/");
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8,
                 &bStack_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_228 + 0x40),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8,
                 ".cs");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&bStack_248);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&local_1c8);
  std::__cxx11::string::string
            ((string *)&bStack_248,local_1e8._M_dataplus._M_p,(allocator *)local_228);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&local_1c8,(char *)&bStack_248,__oflag);
  std::__cxx11::string::~string((string *)&bStack_248);
  reset_indent(this);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&bStack_248,this);
  poVar2 = std::operator<<((ostream *)&local_1c8,(string *)&bStack_248);
  netstd_type_usings_abi_cxx11_((string *)local_228,this);
  this_00 = (t_netstd_generator *)local_228;
  poVar2 = std::operator<<(poVar2,(string *)this_00);
  netstd_thrift_usings_abi_cxx11_((string *)(local_228 + 0x20),this_00);
  poVar2 = std::operator<<(poVar2,(string *)(local_228 + 0x20));
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(local_228 + 0x20));
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::~string((string *)&bStack_248);
  out = &local_1c8;
  generate_netstd_struct_definition(this,(ostream *)out,tstruct,is_exception,false,false);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&local_1c8,(int)out);
  t_generator::indent_validate((t_generator *)this,expected,"generate_netstd_struct");
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&local_1c8);
  std::__cxx11::string::~string((string *)(local_228 + 0x40));
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct(t_struct* tstruct, bool is_exception)
{
    int ic = indent_count();

    string f_struct_name = namespace_dir_ + "/" + (tstruct->get_name()) + ".cs";
    ofstream_with_content_based_conditional_update f_struct;

    f_struct.open(f_struct_name.c_str());

  reset_indent();
    f_struct << autogen_comment() << netstd_type_usings() << netstd_thrift_usings() << endl;

    generate_netstd_struct_definition(f_struct, tstruct, is_exception);

    f_struct.close();

    indent_validate(ic, "generate_netstd_struct");
}